

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.cpp
# Opt level: O3

void __thiscall llvm::ManagedStaticBase::destroy(ManagedStaticBase *this)

{
  if (this->DeleterFn == (_func_void_void_ptr *)0x0) {
    __assert_fail("DeleterFn && \"ManagedStatic not initialized correctly!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                  ,0x40,"void llvm::ManagedStaticBase::destroy() const");
  }
  if (StaticList == this) {
    StaticList = this->Next;
    this->Next = (ManagedStaticBase *)0x0;
    (*this->DeleterFn)((this->Ptr)._M_b._M_p);
    LOCK();
    (this->Ptr)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    this->DeleterFn = (_func_void_void_ptr *)0x0;
    return;
  }
  __assert_fail("StaticList == this && \"Not destroyed in reverse order of construction?\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                ,0x42,"void llvm::ManagedStaticBase::destroy() const");
}

Assistant:

void ManagedStaticBase::destroy() const {
  assert(DeleterFn && "ManagedStatic not initialized correctly!");
  assert(StaticList == this &&
         "Not destroyed in reverse order of construction?");
  // Unlink from list.
  StaticList = Next;
  Next = nullptr;

  // Destroy memory.
  DeleterFn(Ptr);

  // Cleanup.
  Ptr = nullptr;
  DeleterFn = nullptr;
}